

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

void __thiscall
TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_>::AddItem
          (TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *this,
          TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *data)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  value_type *in_stack_ffffffffffffffd8;
  list<TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>,_std::allocator<TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  std::__cxx11::
  list<TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>,_std::allocator<TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>_>_>
  ::push_back(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f81641);
  return;
}

Assistant:

void AddItem(TPZDohrPrecondV2SubData<TVar, TSubStruct> &data)
	{
        std::lock_guard<std::mutex> lock(fAccessLock);
	  fWork.push_back(data);
	}